

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O0

int __thiscall CatalogReader::getCourseUnits(CatalogReader *this,string *courseTitle)

{
  exception *e;
  string local_40;
  string *local_20;
  string *courseTitle_local;
  CatalogReader *this_local;
  
  local_20 = courseTitle;
  courseTitle_local = (string *)this;
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_40,(ulong)courseTitle);
  this_local._4_4_ = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_40);
  return this_local._4_4_;
}

Assistant:

int getCourseUnits(string& courseTitle) const {
			try {
				return stoi(courseTitle.substr(courseTitle.length() - 2));
			} catch (exception &e) {
				return 4;
			}
		}